

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::StrengthReductionPass::ReplaceMultiplyByPowerOf2
          (StrengthReductionPass *this,iterator *inst)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t res_id;
  Instruction *pIVar4;
  DefUseManager *pDVar5;
  Operand *__x;
  IRContext *pIVar6;
  Instruction *this_00;
  Instruction *inst_to_delete;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_d8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  newInstruction;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined1 local_90 [8];
  Operand shiftOperand;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> newOperands;
  uint32_t newResultId;
  uint32_t shiftConstResultId;
  uint32_t shiftAmount;
  uint32_t constVal;
  Instruction *opInst;
  uint32_t local_28;
  uint32_t opId;
  int i;
  bool modified;
  iterator *inst_local;
  StrengthReductionPass *this_local;
  
  pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->(&inst->super_iterator);
  OVar2 = opt::Instruction::opcode(pIVar4);
  if (OVar2 != OpIMul) {
    __assert_fail("(*inst)->opcode() == spv::Op::OpIMul && \"Only works for multiplication of integers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/strength_reduction_pass.cpp"
                  ,0x45,
                  "bool spvtools::opt::StrengthReductionPass::ReplaceMultiplyByPowerOf2(BasicBlock::iterator *)"
                 );
  }
  pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->(&inst->super_iterator);
  uVar3 = opt::Instruction::type_id(pIVar4);
  if (uVar3 != *(uint32_t *)&(this->super_Pass).field_0x34) {
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->(&inst->super_iterator);
    uVar3 = opt::Instruction::type_id(pIVar4);
    if (uVar3 != this->uint32_type_id_) {
      return false;
    }
  }
  local_28 = 0;
  do {
    if (1 < (int)local_28) {
      return false;
    }
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->(&inst->super_iterator);
    uVar3 = opt::Instruction::GetSingleWordInOperand(pIVar4,local_28);
    pDVar5 = Pass::get_def_use_mgr(&this->super_Pass);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar5,uVar3);
    OVar2 = opt::Instruction::opcode(pIVar4);
    if (OVar2 == OpConstant) {
      uVar3 = opt::Instruction::GetSingleWordOperand(pIVar4,2);
      bVar1 = anon_unknown_14::IsPowerOf2(uVar3);
      if (bVar1) {
        uVar3 = anon_unknown_14::CountTrailingZeros(uVar3);
        uVar3 = GetConstantId(this,uVar3);
        res_id = Pass::TakeNextId(&this->super_Pass);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &shiftOperand.words.large_data_);
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->(&inst->super_iterator);
        __x = opt::Instruction::GetInOperand(pIVar4,1 - local_28);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &shiftOperand.words.large_data_,__x);
        init_list._M_len = 1;
        init_list._M_array =
             (iterator)
             ((long)&newInstruction._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 4);
        newInstruction._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = uVar3;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list);
        Operand::Operand((Operand *)local_90,SPV_OPERAND_TYPE_ID,&local_b8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &shiftOperand.words.large_data_,(value_type *)local_90);
        pIVar4 = (Instruction *)::operator_new(0x70);
        pIVar6 = Pass::context(&this->super_Pass);
        this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator->(&inst->super_iterator);
        uVar3 = opt::Instruction::type_id(this_00);
        opt::Instruction::Instruction
                  (pIVar4,pIVar6,OpShiftLeftLogical,uVar3,res_id,
                   (OperandList *)&shiftOperand.words.large_data_);
        std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
        ::unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                  ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                    *)&local_d8,pIVar4);
        InstructionList::iterator::InsertBefore
                  ((iterator *)&inst_to_delete,
                   (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)inst);
        InstructionList::iterator::operator=(inst,(iterator *)&inst_to_delete);
        pDVar5 = Pass::get_def_use_mgr(&this->super_Pass);
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&inst->super_iterator);
        analysis::DefUseManager::AnalyzeInstDefUse(pDVar5,pIVar4);
        InstructionList::iterator::operator++(inst);
        pIVar6 = Pass::context(&this->super_Pass);
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->(&inst->super_iterator);
        uVar3 = opt::Instruction::result_id(pIVar4);
        IRContext::ReplaceAllUsesWith(pIVar6,uVar3,res_id);
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&inst->super_iterator);
        InstructionList::iterator::operator--(inst);
        pIVar6 = Pass::context(&this->super_Pass);
        IRContext::KillInst(pIVar6,pIVar4);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr(&local_d8);
        Operand::~Operand((Operand *)local_90);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &shiftOperand.words.large_data_);
        return true;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool StrengthReductionPass::ReplaceMultiplyByPowerOf2(
    BasicBlock::iterator* inst) {
  assert((*inst)->opcode() == spv::Op::OpIMul &&
         "Only works for multiplication of integers.");
  bool modified = false;

  // Currently only works on 32-bit integers.
  if ((*inst)->type_id() != int32_type_id_ &&
      (*inst)->type_id() != uint32_type_id_) {
    return modified;
  }

  // Check the operands for a constant that is a power of 2.
  for (int i = 0; i < 2; i++) {
    uint32_t opId = (*inst)->GetSingleWordInOperand(i);
    Instruction* opInst = get_def_use_mgr()->GetDef(opId);
    if (opInst->opcode() == spv::Op::OpConstant) {
      // We found a constant operand.
      uint32_t constVal = opInst->GetSingleWordOperand(2);

      if (IsPowerOf2(constVal)) {
        modified = true;
        uint32_t shiftAmount = CountTrailingZeros(constVal);
        uint32_t shiftConstResultId = GetConstantId(shiftAmount);

        // Create the new instruction.
        uint32_t newResultId = TakeNextId();
        std::vector<Operand> newOperands;
        newOperands.push_back((*inst)->GetInOperand(1 - i));
        Operand shiftOperand(spv_operand_type_t::SPV_OPERAND_TYPE_ID,
                             {shiftConstResultId});
        newOperands.push_back(shiftOperand);
        std::unique_ptr<Instruction> newInstruction(
            new Instruction(context(), spv::Op::OpShiftLeftLogical,
                            (*inst)->type_id(), newResultId, newOperands));

        // Insert the new instruction and update the data structures.
        (*inst) = (*inst).InsertBefore(std::move(newInstruction));
        get_def_use_mgr()->AnalyzeInstDefUse(&*(*inst));
        ++(*inst);
        context()->ReplaceAllUsesWith((*inst)->result_id(), newResultId);

        // Remove the old instruction.
        Instruction* inst_to_delete = &*(*inst);
        --(*inst);
        context()->KillInst(inst_to_delete);

        // We do not want to replace the instruction twice if both operands
        // are constants that are a power of 2.  So we break here.
        break;
      }
    }
  }

  return modified;
}